

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O1

Vec3 OpenSteer::RandomVectorInUnitRadiusSphere(void)

{
  int iVar1;
  int iVar2;
  float fVar3;
  Vec3 VVar4;
  
  do {
    iVar1 = rand();
    iVar2 = rand();
    VVar4.x = (float)iVar1 * 4.656613e-10 + (float)iVar1 * 4.656613e-10 + -1.0;
    VVar4.y = (float)iVar2 * 4.656613e-10 + (float)iVar2 * 4.656613e-10 + -1.0;
    iVar1 = rand();
    VVar4.z = (float)iVar1 * 4.656613e-10 + (float)iVar1 * 4.656613e-10 + -1.0;
    fVar3 = VVar4.z * VVar4.z + VVar4.x * VVar4.x + VVar4.y * VVar4.y;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
  } while (1.0 <= fVar3);
  return VVar4;
}

Assistant:

OpenSteer::Vec3 
OpenSteer::RandomVectorInUnitRadiusSphere (void)
{
    Vec3 v;

    do
    {
        v.set ((frandom01()*2) - 1,
               (frandom01()*2) - 1,
               (frandom01()*2) - 1);
    }
    while (v.length() >= 1);

    return v;
}